

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O2

btVector3 __thiscall btSphereShape::localGetSupportingVertex(btSphereShape *this,btVector3 *vec)

{
  float extraout_XMM0_Da;
  btScalar bVar1;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  undefined4 in_XMM1_Db;
  btVector3 bVar2;
  btVector3 local_48;
  float local_38;
  float fStack_34;
  float local_28;
  undefined4 uStack_24;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x11])();
  local_48.m_floats._0_8_ = *(undefined8 *)vec->m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)(vec->m_floats + 2);
  local_38 = extraout_XMM0_Da;
  fStack_34 = extraout_XMM0_Db;
  local_28 = in_XMM1_Da;
  uStack_24 = in_XMM1_Db;
  bVar1 = btVector3::length2(&local_48);
  if (bVar1 < 1.4210855e-14) {
    local_48.m_floats[0] = -1.0;
    local_48.m_floats[1] = -1.0;
    local_48.m_floats[2] = -1.0;
    local_48.m_floats[3] = 0.0;
  }
  btVector3::normalize(&local_48);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  bVar2.m_floats[0] = extraout_XMM0_Da_00 * local_48.m_floats[0] + local_38;
  bVar2.m_floats[1] = extraout_XMM0_Da_00 * local_48.m_floats[1] + fStack_34;
  bVar2.m_floats[2] = local_28 + local_48.m_floats[2] * extraout_XMM0_Da_00;
  bVar2.m_floats[3] = (btScalar)uStack_24;
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3	btSphereShape::localGetSupportingVertex(const btVector3& vec)const
{
	btVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	btVector3 vecnorm = vec;
	if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
	{
		vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
	} 
	vecnorm.normalize();
	supVertex+= getMargin() * vecnorm;
	return supVertex;
}